

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  bool bVar1;
  CppType CVar2;
  int32_t i32;
  uint32_t u32;
  Type TVar3;
  LogMessage *pLVar4;
  int64_t i64;
  uint64_t u64;
  char *pcVar5;
  string *psVar6;
  EnumValueDescriptor *this_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  float value;
  double value_00;
  allocator local_1f2;
  LogFinisher local_1f1;
  LogMessage local_1f0;
  LogFinisher local_1b1;
  LogMessage local_1b0;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator local_131;
  AlphaNum local_130;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  byte local_19;
  FieldDescriptor *pFStack_18;
  bool quote_string_type_local;
  FieldDescriptor *this_local;
  
  pLVar4 = (LogMessage *)this;
  local_19 = quote_string_type;
  pFStack_18 = this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = has_default_value(this);
  local_59 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x9fe);
    local_59 = 1;
    pLVar4 = internal::LogMessage::operator<<(&local_58,"CHECK failed: has_default_value(): ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,"No default value");
    internal::LogFinisher::operator=(local_6d,pLVar4);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  CVar2 = cpp_type(this);
  switch(CVar2) {
  case CPPTYPE_INT32:
    i32 = default_value_int32_t(this);
    strings::AlphaNum::AlphaNum(&local_a0,i32);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_a0,a);
    break;
  case CPPTYPE_INT64:
    i64 = default_value_int64_t(this);
    strings::AlphaNum::AlphaNum(&local_d0,i64);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_d0,a_00);
    break;
  case CPPTYPE_UINT32:
    u32 = default_value_uint32_t(this);
    strings::AlphaNum::AlphaNum(&local_100,u32);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_100,a_01);
    break;
  case CPPTYPE_UINT64:
    u64 = default_value_uint64_t(this);
    strings::AlphaNum::AlphaNum(&local_130,u64);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_130,a_02);
    break;
  case CPPTYPE_DOUBLE:
    value_00 = default_value_double(this);
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar4,value_00);
    break;
  case CPPTYPE_FLOAT:
    value = default_value_float(this);
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar4,value);
    break;
  case CPPTYPE_BOOL:
    bVar1 = default_value_bool(this);
    pcVar5 = "false";
    if (bVar1) {
      pcVar5 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_131);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    break;
  case CPPTYPE_ENUM:
    this_00 = default_value_enum(this);
    psVar6 = EnumValueDescriptor::name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
    break;
  case CPPTYPE_STRING:
    if ((local_19 & 1) == 0) {
      TVar3 = type(this);
      if (TVar3 == TYPE_BYTES) {
        psVar6 = default_value_string_abi_cxx11_(this);
        CEscape(__return_storage_ptr__,psVar6);
      }
      else {
        psVar6 = default_value_string_abi_cxx11_(this);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
      }
    }
    else {
      psVar6 = default_value_string_abi_cxx11_(this);
      CEscape(&local_178,psVar6);
      std::operator+(&local_158,"\"",&local_178);
      std::operator+(__return_storage_ptr__,&local_158,"\"");
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    break;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_1b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xa1b);
    pLVar4 = internal::LogMessage::operator<<(&local_1b0,"Messages can\'t have default values!");
    internal::LogFinisher::operator=(&local_1b1,pLVar4);
    internal::LogMessage::~LogMessage(&local_1b0);
  default:
    internal::LogMessage::LogMessage
              (&local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xa1e);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_1f0,"Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=(&local_1f1,pLVar4);
    internal::LogMessage::~LogMessage(&local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1f2);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return StrCat(default_value_int32_t());
    case CPPTYPE_INT64:
      return StrCat(default_value_int64_t());
    case CPPTYPE_UINT32:
      return StrCat(default_value_uint32_t());
    case CPPTYPE_UINT64:
      return StrCat(default_value_uint64_t());
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}